

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O0

void __thiscall cmCTestP4::DescribeParser::DoBodyLine(DescribeParser *this)

{
  char *pcVar1;
  string local_30 [32];
  DescribeParser *local_10;
  DescribeParser *this_local;
  
  local_10 = this;
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)&(this->super_LineParser).Line);
  if (*pcVar1 == '\t') {
    std::__cxx11::string::substr((ulong)local_30,(ulong)&(this->super_LineParser).Line);
    std::__cxx11::string::operator+=((string *)&(this->Rev).Log,local_30);
    std::__cxx11::string::~string(local_30);
  }
  std::__cxx11::string::operator+=((string *)&(this->Rev).Log,"\n");
  return;
}

Assistant:

void DoBodyLine()
  {
    if (this->Line[0] == '\t') {
      this->Rev.Log += this->Line.substr(1);
    }
    this->Rev.Log += "\n";
  }